

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O2

pair<const_unsigned_short_*,_const_unsigned_short_*> __thiscall
frozen::
unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>::
equal_range<int>(unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>
                 *this,int *key)

{
  const_iterator pvVar1;
  pair<const_unsigned_short_*,_const_unsigned_short_*> pVar2;
  
  pVar2.first = find<int>(this,key);
  pvVar1 = pVar2.first + 1;
  if (pVar2.first == (const_iterator)&this->field_0x6) {
    pvVar1 = (const_iterator)&this->field_0x6;
  }
  pVar2.second = pvVar1;
  return pVar2;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }